

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMbuffer cm_buffer_dump_list(CManager_conflict cm)

{
  long in_RDI;
  CMbuffer tmp;
  long *local_10;
  
  local_10 = *(long **)(in_RDI + 0xe8);
  printf("Known CM buffers are:\n");
  for (; local_10 != (long *)0x0; local_10 = (long *)local_10[3]) {
    printf("Buffer begin %p, size %zd, end %p\n",*local_10,local_10[1],*local_10 + local_10[1]);
  }
  return (CMbuffer)0x0;
}

Assistant:

static CMbuffer
 cm_buffer_dump_list(CManager cm)
 {
     CMbuffer tmp = cm->cm_buffer_list;
     printf("Known CM buffers are:\n");
     while (tmp != NULL) {
	 printf("Buffer begin %p, size %zd, end %p\n",
		tmp->buffer, tmp->size, (char*)tmp->buffer + tmp->size);
	 tmp = tmp->next;
     }
     return NULL;
 }